

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O2

void __thiscall QBoxLayoutPrivate::setupGeom(QBoxLayoutPrivate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Direction DVar5;
  QLayout *this_00;
  QBoxLayoutItem *this_01;
  Representation RVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  Int IVar17;
  uint uVar18;
  Representation RVar19;
  Representation RVar20;
  int boxmax;
  int extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  QWidget *pQVar21;
  pointer pQVar22;
  QSize QVar23;
  byte bVar24;
  Representation RVar25;
  QSize QVar26;
  uint uVar27;
  long lVar28;
  QSize QVar29;
  QFlagsStorage<QSizePolicy::ControlType> controls2;
  uint uVar30;
  ulong uVar31;
  long in_FS_OFFSET;
  bool bVar32;
  QSize QVar33;
  uint local_f4;
  QFlagsStorage<QSizePolicy::ControlType> local_ec;
  int local_e0;
  int local_dc;
  QStyle *local_b8;
  bool dummy;
  QArrayDataPointer<QLayoutStruct> local_68;
  bool verexp;
  bool horexp;
  int maxh;
  int maxw;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x118 & 2) != 0) {
    this_00 = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
    bVar32 = this->dir < Down;
    maxw = 0x7ffff;
    if (bVar32) {
      maxw = 0;
    }
    maxh = 0x7ffff;
    if (!bVar32) {
      maxh = 0;
    }
    horexp = false;
    verexp = false;
    this->field_0x118 = this->field_0x118 & 0xfe;
    uVar31 = (this->list).d.size;
    QList<QLayoutStruct>::clear(&this->geomArray);
    iVar10 = (int)uVar31;
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)&local_68,(long)iVar10);
    uVar9 = (**(code **)(*(long *)this_00 + 0x60))(this_00);
    if (((int)uVar9 < 0) && (pQVar21 = QLayout::parentWidget(this_00), pQVar21 != (QWidget *)0x0)) {
      local_b8 = QWidget::style(pQVar21);
    }
    else {
      local_b8 = (QStyle *)0x0;
    }
    uVar31 = uVar31 & 0xffffffff;
    if (iVar10 < 1) {
      uVar31 = 0;
    }
    local_f4 = 0xffffffff;
    uVar30 = 0;
    local_ec.i = 0;
    local_dc = 0;
    local_e0 = 0;
    RVar20.m_i = 0;
    RVar19.m_i = 0;
    for (lVar28 = 0; uVar31 << 3 != lVar28; lVar28 = lVar28 + 8) {
      this_01 = *(QBoxLayoutItem **)((long)(this->list).d.ptr + lVar28);
      iVar10 = (*this_01->item->_vptr_QLayoutItem[4])();
      iVar11 = (*this_01->item->_vptr_QLayoutItem[3])();
      iVar12 = (*this_01->item->_vptr_QLayoutItem[2])();
      uVar13 = (*this_01->item->_vptr_QLayoutItem[5])();
      iVar14 = (*this_01->item->_vptr_QLayoutItem[8])();
      if (SUB41(iVar14,0) == false) {
        uVar7 = uVar30;
        if ((int)uVar9 < 0) {
          IVar17 = (*this_01->item->_vptr_QLayoutItem[0x10])();
          if (-1 < (int)local_f4) {
            DVar5 = this->dir;
            controls2.i = IVar17;
            if ((DVar5 | Down) == BottomToTop) {
              controls2.i = local_ec.i;
              local_ec.i = IVar17;
            }
            if (local_b8 == (QStyle *)0x0) {
              local_ec.i = IVar17;
              uVar18 = 0;
            }
            else {
              pQVar21 = QLayout::parentWidget(this_00);
              uVar18 = QStyle::combinedLayoutSpacing
                                 (local_b8,(ControlTypes)local_ec.i,(ControlTypes)controls2.i,
                                  Vertical - (DVar5 < Down),(QStyleOption *)0x0,pQVar21);
              local_ec.i = IVar17;
              if ((int)uVar18 < 1) {
                uVar18 = 0;
              }
            }
            goto LAB_002c9279;
          }
          uVar16 = 0;
          uVar27 = 0;
          local_ec.i = IVar17;
        }
        else {
          uVar16 = 0;
          uVar27 = uVar16;
          uVar18 = uVar9;
          if (-1 < (int)local_f4) {
LAB_002c9279:
            pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_68);
            pQVar22[local_f4].spacing = uVar18;
            uVar16 = 0;
            uVar27 = uVar18;
          }
        }
      }
      else {
        iVar15 = (*this_01->item->_vptr_QLayoutItem[0xd])();
        uVar16 = (uint)(CONCAT44(extraout_var_01,iVar15) != 0);
        uVar27 = 0;
        uVar7 = local_f4;
      }
      local_f4 = uVar7;
      dummy = true;
      if (this->dir < Down) {
        bVar32 = true;
        if ((uVar13 & 1) == 0) {
          bVar32 = 0 < this_01->stretch;
        }
        horexp = (bool)(horexp & 1U | bVar32);
        maxw = maxw + iVar10 + uVar27;
        if ((char)uVar16 == '\0') {
          iVar15 = (*this_01->item->_vptr_QLayoutItem[8])();
          qMaxExpCalc(&maxh,&verexp,&dummy,boxmax,SUB41((uVar13 & 2) >> 1,0),SUB41(iVar15,0));
        }
        RVar19.m_i = RVar19.m_i + iVar11 + uVar27;
        local_e0 = local_e0 + iVar12 + uVar27;
        if (RVar20.m_i <= extraout_var) {
          RVar20.m_i = extraout_var;
        }
        if (local_dc <= extraout_var_00) {
          local_dc = extraout_var_00;
        }
        pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_68);
        (&pQVar22->sizeHint)[lVar28] = iVar12;
        pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_68);
        (&pQVar22->maximumSize)[lVar28] = iVar10;
        pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_68);
        (&pQVar22->minimumSize)[lVar28] = iVar11;
        pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_68);
        (&pQVar22->expansive)[lVar28 * 4] = bVar32;
        iVar10 = this_01->stretch;
        if (iVar10 == 0) {
          iVar10 = QBoxLayoutItem::hStretch(this_01);
        }
      }
      else {
        bVar32 = true;
        if ((uVar13 & 2) == 0) {
          bVar32 = 0 < this_01->stretch;
        }
        verexp = (bool)(verexp & 1U | bVar32);
        maxh = maxh + uVar27 + boxmax;
        if ((char)uVar16 == '\0') {
          iVar15 = (*this_01->item->_vptr_QLayoutItem[8])();
          qMaxExpCalc(&maxw,&horexp,&dummy,iVar10,(bool)((byte)uVar13 & 1),SUB41(iVar15,0));
        }
        RVar20.m_i = RVar20.m_i + extraout_var + uVar27;
        local_dc = local_dc + extraout_var_00 + uVar27;
        if (RVar19.m_i <= iVar11) {
          RVar19.m_i = iVar11;
        }
        if (local_e0 <= iVar12) {
          local_e0 = iVar12;
        }
        pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_68);
        (&pQVar22->sizeHint)[lVar28] = extraout_var_00;
        pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_68);
        (&pQVar22->maximumSize)[lVar28] = boxmax;
        pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_68);
        (&pQVar22->minimumSize)[lVar28] = extraout_var;
        pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_68);
        (&pQVar22->expansive)[lVar28 * 4] = bVar32;
        iVar10 = this_01->stretch;
        if (iVar10 == 0) {
          iVar10 = QBoxLayoutItem::vStretch(this_01);
        }
      }
      pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_68);
      (&pQVar22->stretch)[lVar28] = iVar10;
      pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_68);
      (&pQVar22->empty)[lVar28 * 4] = SUB41(iVar14,0);
      pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_68);
      (&pQVar22->spacing)[lVar28] = 0;
      bVar24 = this->field_0x118;
      bVar8 = 1;
      if ((bVar24 & 1) == 0) {
        iVar10 = (*this_01->item->_vptr_QLayoutItem[9])();
        bVar8 = (byte)iVar10;
        bVar24 = this->field_0x118;
      }
      this->field_0x118 = bVar24 & 0xfe | bVar8;
      uVar30 = uVar30 + 1;
    }
    QArrayDataPointer<QLayoutStruct>::operator=(&(this->geomArray).d,&local_68);
    (this->expanding).super_QFlagsStorageHelper<Qt::Orientation,_4>.
    super_QFlagsStorage<Qt::Orientation>.i = (uint)horexp + (uint)verexp * 2;
    QVar26.ht.m_i = RVar20.m_i;
    QVar26.wd.m_i = RVar19.m_i;
    this->minSize = QVar26;
    RVar6.m_i = maxw;
    if (maxw <= RVar19.m_i) {
      RVar6.m_i = RVar19.m_i;
    }
    RVar25.m_i = maxh;
    if (maxh <= RVar20.m_i) {
      RVar25.m_i = RVar20.m_i;
    }
    if (RVar19.m_i < local_e0) {
      RVar19.m_i = local_e0;
    }
    if (RVar20.m_i < local_dc) {
      RVar20.m_i = local_dc;
    }
    if (RVar6.m_i <= RVar19.m_i) {
      RVar19.m_i = RVar6.m_i;
    }
    QVar23.ht.m_i = RVar25.m_i;
    QVar23.wd.m_i = RVar6.m_i;
    if (RVar25.m_i <= RVar20.m_i) {
      RVar20.m_i = RVar25.m_i;
    }
    this->maxSize = QVar23;
    QVar29.ht.m_i = RVar20.m_i;
    QVar29.wd.m_i = RVar19.m_i;
    this->sizeHint = QVar29;
    QLayout::getContentsMargins
              (this_00,&this->leftMargin,&this->topMargin,&this->rightMargin,&this->bottomMargin);
    uVar1 = this->rightMargin;
    uVar3 = this->bottomMargin;
    uVar2 = this->leftMargin;
    uVar4 = this->topMargin;
    iVar12 = uVar2 + uVar1;
    iVar14 = uVar4 + uVar3;
    QVar33.wd.m_i = (this->maxSize).wd.m_i + iVar12;
    QVar33.ht.m_i = (this->maxSize).ht.m_i + iVar14;
    this->maxSize = QVar33;
    iVar10 = (this->minSize).wd.m_i;
    iVar11 = (this->minSize).ht.m_i;
    (this->sizeHint).wd.m_i = (this->sizeHint).wd.m_i + iVar12;
    (this->sizeHint).ht.m_i = (this->sizeHint).ht.m_i + iVar14;
    (this->minSize).wd.m_i = iVar10 + iVar12;
    (this->minSize).ht.m_i = iVar11 + iVar14;
    this->field_0x118 = this->field_0x118 & 0xfd;
    QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBoxLayoutPrivate::setupGeom()
{
    if (!dirty)
        return;

    Q_Q(QBoxLayout);
    int maxw = horz(dir) ? 0 : QLAYOUTSIZE_MAX;
    int maxh = horz(dir) ? QLAYOUTSIZE_MAX : 0;
    int minw = 0;
    int minh = 0;
    int hintw = 0;
    int hinth = 0;

    bool horexp = false;
    bool verexp = false;

    hasHfw = false;

    int n = list.size();
    geomArray.clear();
    QList<QLayoutStruct> a(n);

    QSizePolicy::ControlTypes controlTypes1;
    QSizePolicy::ControlTypes controlTypes2;
    int fixedSpacing = q->spacing();
    int previousNonEmptyIndex = -1;

    QStyle *style = nullptr;
    if (fixedSpacing < 0) {
        if (QWidget *parentWidget = q->parentWidget())
            style = parentWidget->style();
    }

    for (int i = 0; i < n; i++) {
        QBoxLayoutItem *box = list.at(i);
        QSize max = box->item->maximumSize();
        QSize min = box->item->minimumSize();
        QSize hint = box->item->sizeHint();
        Qt::Orientations exp = box->item->expandingDirections();
        bool empty = box->item->isEmpty();
        int spacing = 0;

        if (!empty) {
            if (fixedSpacing >= 0) {
                spacing = (previousNonEmptyIndex >= 0) ? fixedSpacing : 0;
#ifdef Q_OS_MAC
                if (!horz(dir) && previousNonEmptyIndex >= 0) {
                    QBoxLayoutItem *sibling = (dir == QBoxLayout::TopToBottom  ? box : list.at(previousNonEmptyIndex));
                    if (sibling) {
                        QWidget *wid = sibling->item->widget();
                        if (wid)
                            spacing = qMax(spacing, sibling->item->geometry().top() - wid->geometry().top());
                    }
                }
#endif
            } else {
                controlTypes1 = controlTypes2;
                controlTypes2 = box->item->controlTypes();
                if (previousNonEmptyIndex >= 0) {
                    QSizePolicy::ControlTypes actual1 = controlTypes1;
                    QSizePolicy::ControlTypes actual2 = controlTypes2;
                    if (dir == QBoxLayout::RightToLeft || dir == QBoxLayout::BottomToTop)
                        qSwap(actual1, actual2);

                    if (style) {
                        spacing = style->combinedLayoutSpacing(actual1, actual2,
                                             horz(dir) ? Qt::Horizontal : Qt::Vertical,
                                             nullptr, q->parentWidget());
                        if (spacing < 0)
                            spacing = 0;
                    }
                }
            }

            if (previousNonEmptyIndex >= 0)
                a[previousNonEmptyIndex].spacing = spacing;
            previousNonEmptyIndex = i;
        }

        bool ignore = empty && box->item->widget(); // ignore hidden widgets
        bool dummy = true;
        if (horz(dir)) {
            bool expand = (exp & Qt::Horizontal || box->stretch > 0);
            horexp = horexp || expand;
            maxw += spacing + max.width();
            minw += spacing + min.width();
            hintw += spacing + hint.width();
            if (!ignore)
                qMaxExpCalc(maxh, verexp, dummy,
                            max.height(), exp & Qt::Vertical, box->item->isEmpty());
            minh = qMax(minh, min.height());
            hinth = qMax(hinth, hint.height());

            a[i].sizeHint = hint.width();
            a[i].maximumSize = max.width();
            a[i].minimumSize = min.width();
            a[i].expansive = expand;
            a[i].stretch = box->stretch ? box->stretch : box->hStretch();
        } else {
            bool expand = (exp & Qt::Vertical || box->stretch > 0);
            verexp = verexp || expand;
            maxh += spacing + max.height();
            minh += spacing + min.height();
            hinth += spacing + hint.height();
            if (!ignore)
                qMaxExpCalc(maxw, horexp, dummy,
                            max.width(), exp & Qt::Horizontal, box->item->isEmpty());
            minw = qMax(minw, min.width());
            hintw = qMax(hintw, hint.width());

            a[i].sizeHint = hint.height();
            a[i].maximumSize = max.height();
            a[i].minimumSize = min.height();
            a[i].expansive = expand;
            a[i].stretch = box->stretch ? box->stretch : box->vStretch();
        }

        a[i].empty = empty;
        a[i].spacing = 0;   // might be initialized with a non-zero value in a later iteration
        hasHfw = hasHfw || box->item->hasHeightForWidth();
    }

    geomArray = a;

    expanding = (Qt::Orientations)
                       ((horexp ? Qt::Horizontal : 0)
                         | (verexp ? Qt::Vertical : 0));

    minSize = QSize(minw, minh);
    maxSize = QSize(maxw, maxh).expandedTo(minSize);
    sizeHint = QSize(hintw, hinth).expandedTo(minSize).boundedTo(maxSize);

    q->getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);
    int left, top, right, bottom;
    effectiveMargins(&left, &top, &right, &bottom);
    QSize extra(left + right, top + bottom);

    minSize += extra;
    maxSize += extra;
    sizeHint += extra;

    dirty = false;
}